

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O0

LogStream * __thiscall cppnet::LogStream::operator<<(LogStream *this,uint64_t v)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  uint64_t v_local;
  LogStream *this_local;
  
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if ((bVar3) &&
     (peVar5 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this), peVar5->_len < 0x400)) {
    peVar5 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    pcVar2 = peVar5->_log;
    peVar5 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar1 = peVar5->_len;
    peVar5 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar4 = snprintf(pcVar2 + uVar1,(ulong)(0x400 - peVar5->_len),"%lu",v);
    peVar5 = std::__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::Log,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    peVar5->_len = iVar4 + peVar5->_len;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(uint64_t v) {
    CHECK_CONTINUE()
#ifdef __win__
    _log->_len += snprintf(_log->_log + _log->_len, __log_block_size - _log->_len, "%I64u", v);
#else
    _log->_len += snprintf(_log->_log + _log->_len, __log_block_size - _log->_len, "%lu", v);
#endif
    return *this;
}